

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O1

CharString * __thiscall
icu_63::CharString::appendPathPart(CharString *this,StringPiece s,UErrorCode *errorCode)

{
  if (s.length_ != 0 && *errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((0 < (long)this->len) && ((this->buffer).ptr[(long)this->len + -1] != '/')) {
      append(this,'/',errorCode);
    }
    append(this,s.ptr_,s.length_,errorCode);
  }
  return this;
}

Assistant:

CharString &CharString::appendPathPart(StringPiece s, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(s.length()==0) {
        return *this;
    }
    char c;
    if(len>0 && (c=buffer[len-1])!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
        append(U_FILE_SEP_CHAR, errorCode);
    }
    append(s, errorCode);
    return *this;
}